

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_server.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  lscpp_message_handler local_44;
  _Head_base<0UL,_lscpp::transporter::iface_*,_false> local_40;
  stdio_transporter local_38;
  
  local_44.shutdown_ = false;
  local_44.initialized_ = false;
  local_44.ready_ = false;
  lscpp::stdio_transporter::stdio_transporter(&local_38,false);
  lscpp::transporter::transporter<lscpp::stdio_transporter>((transporter *)&local_40,&local_38);
  lscpp::experimental::launch<my_lsp_server::server>((server *)&local_44,(transporter *)&local_40);
  if (local_40._M_head_impl != (iface *)0x0) {
    (*(local_40._M_head_impl)->_vptr_iface[1])();
  }
  local_40._M_head_impl = (iface *)0x0;
  if (local_38.data_._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0) {
    operator_delete__((void *)local_38.data_._M_t.
                              super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                              super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                              super__Head_base<0UL,_char_*,_false>._M_head_impl);
  }
  local_38.data_._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0;
  if (local_38.comm_logger_.super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
      super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
      super__Optional_payload_base<lscpp::comm_logger>._M_engaged == true) {
    local_38.comm_logger_.super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
    super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
    super__Optional_payload_base<lscpp::comm_logger>._M_engaged = false;
    lscpp::comm_logger::~comm_logger((comm_logger *)&local_38);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  lscpp::experimental::launch(my_lsp_server::server{},
                              lscpp::stdio_transporter{false});
}